

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O0

__m256i * dc_sum_64(uint8_t *ref)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 (*in_RDI) [32];
  __m256i u0;
  __m256i y1;
  __m256i y0;
  __m256i zero;
  __m256i x1;
  __m256i x0;
  ulong uStack_1b8;
  
  uStack_1b8 = SUB328(ZEXT832(0),4);
  auVar1 = vpsadbw_avx2(*in_RDI,ZEXT832(uStack_1b8) << 0x40);
  auVar2 = vpsadbw_avx2((undefined1  [32])*(__m256i *)(in_RDI + 1),ZEXT832(uStack_1b8) << 0x40);
  auVar1 = vpaddq_avx2(auVar1,auVar2);
  auVar2 = vpermq_avx2(auVar1,0x4e);
  auVar1 = vpaddq_avx2(auVar2,auVar1);
  auVar2 = vpunpckhqdq_avx2(auVar1,auVar1);
  vpaddw_avx2(auVar1,auVar2);
  return (__m256i *)(in_RDI + 1);
}

Assistant:

static inline __m128i dc_sum_64(const uint8_t *ref) {
  __m128i x0 = _mm_load_si128((__m128i const *)ref);
  __m128i x1 = _mm_load_si128((__m128i const *)(ref + 16));
  __m128i x2 = _mm_load_si128((__m128i const *)(ref + 32));
  __m128i x3 = _mm_load_si128((__m128i const *)(ref + 48));
  const __m128i zero = _mm_setzero_si128();
  x0 = _mm_sad_epu8(x0, zero);
  x1 = _mm_sad_epu8(x1, zero);
  x2 = _mm_sad_epu8(x2, zero);
  x3 = _mm_sad_epu8(x3, zero);
  x0 = _mm_add_epi16(x0, x1);
  x2 = _mm_add_epi16(x2, x3);
  x0 = _mm_add_epi16(x0, x2);
  const __m128i high = _mm_unpackhi_epi64(x0, x0);
  return _mm_add_epi16(x0, high);
}